

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O3

void prsdel1(void *ctx0,toksdef *sym)

{
  undefined4 in_EAX;
  char *pcVar1;
  uint label;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)CONCAT24(sym->toksval,in_EAX);
  if (((*(emtcxdef **)((long)ctx0 + 0x28))->emtcxlbl[sym->toksval].emtlflg & 1) == 0) {
    pcVar1 = errstr(*ctx0,sym->toksnam,(uint)sym->tokslen);
    *(char **)(**ctx0 + 0x18) = pcVar1;
    *(undefined4 *)(**ctx0 + 0x68) = 1;
    errlogn(*ctx0,0x14a,"TADS");
    emtclbl(*(emtcxdef **)((long)ctx0 + 0x28),(uint *)((long)&uStack_18 + 4));
  }
  else {
    emtdlbl(*(emtcxdef **)((long)ctx0 + 0x28),(uint *)((long)&uStack_18 + 4));
  }
  sym->toksval = uStack_18._4_2_;
  return;
}

Assistant:

static void prsdel1(void *ctx0, toksdef *sym)
{
    prscxdef *ctx = (prscxdef *)ctx0;
    uint label;

    label = sym->toksval;
    if (!emtqset(ctx->prscxemt, sym->toksval))
    {
        errlog1(ctx->prscxerr, ERR_NOGOTO, ERRTSTR,
                errstr(ctx->prscxerr, sym->toksnam, sym->tokslen));
        emtclbl(ctx->prscxemt, &label);
        sym->toksval = label;
    }
    else
    {
        emtdlbl(ctx->prscxemt, &label);
        sym->toksval = label;
    }
}